

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexical.h
# Opt level: O2

void __thiscall
Description::Description(Description *this,string *name_,int *kind_,int *adr_,int *val_)

{
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)this);
  this->kind = *kind_;
  this->adr = *adr_;
  this->val = *val_;
  return;
}

Assistant:

Description(const std::string &name_, const int &kind_,
	            const int &adr_, const int &val_) {
		name = name_;
		kind = kind_;
		adr = adr_;
		val = val_;
	}